

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void in_memory_snapshot_rollback_test(void)

{
  fdb_status fVar1;
  fdb_seqnum_t rollback_to;
  fdb_seqnum_t c;
  fdb_kvs_info kvs_info;
  fdb_kvs_config kvs_config;
  fdb_doc *rdoc;
  fdb_config config;
  fdb_status status;
  fdb_iterator *iterator;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *kvs;
  fdb_file_handle *file;
  char str [15];
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 in_stack_fffffffffffffce8;
  undefined2 uVar2;
  undefined2 in_stack_fffffffffffffcea;
  undefined2 uVar3;
  undefined4 in_stack_fffffffffffffcec;
  fdb_file_handle *in_stack_fffffffffffffcf0;
  fdb_iterator *in_stack_fffffffffffffcf8;
  fdb_kvs_handle *in_stack_fffffffffffffd08;
  void *in_stack_fffffffffffffd10;
  size_t in_stack_fffffffffffffd18;
  void *in_stack_fffffffffffffd20;
  fdb_kvs_handle *in_stack_fffffffffffffd28;
  fdb_doc **in_stack_fffffffffffffd60;
  fdb_iterator *in_stack_fffffffffffffd68;
  fdb_seqnum_t in_stack_fffffffffffffe10;
  fdb_kvs_handle **handle_ptr;
  fdb_kvs_handle **local_1e0;
  fdb_kvs_handle **local_1d0;
  fdb_kvs_info *in_stack_fffffffffffffe50;
  fdb_kvs_handle *handle;
  undefined1 local_188 [144];
  fdb_config *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  fdb_file_handle **in_stack_ffffffffffffff18;
  fdb_iterator *local_88;
  fdb_kvs_handle *local_80;
  fdb_iterator *local_78;
  fdb_seqnum_t in_stack_ffffffffffffff90;
  fdb_kvs_handle **in_stack_ffffffffffffff98;
  fdb_kvs_handle *in_stack_ffffffffffffffa0;
  uint local_54;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  handle_ptr = (fdb_kvs_handle **)0x3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_188,&stack0xfffffffffffffd20,0xf8);
  fVar1 = fdb_open(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x137c);
    in_memory_snapshot_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x137c,"void in_memory_snapshot_rollback_test()");
    }
  }
  fdb_get_default_kvs_config();
  handle = in_stack_fffffffffffffd08;
  fVar1 = fdb_kvs_open_default
                    (in_stack_fffffffffffffcf0,
                     (fdb_kvs_handle **)
                     CONCAT44(in_stack_fffffffffffffcec,
                              CONCAT22(in_stack_fffffffffffffcea,in_stack_fffffffffffffce8)),
                     (fdb_kvs_config *)0x121223);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x137f);
    in_memory_snapshot_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x137f,"void in_memory_snapshot_rollback_test()");
    }
  }
  local_54 = 1;
  do {
    if (3 < (int)local_54) {
      fdb_commit((fdb_file_handle *)
                 CONCAT44(in_stack_fffffffffffffcec,
                          CONCAT22(in_stack_fffffffffffffcea,in_stack_fffffffffffffce8)),'\0');
      fVar1 = fdb_set_kv(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                         in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                         (size_t)in_stack_fffffffffffffd08);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x138c);
        in_memory_snapshot_rollback_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x138c,"void in_memory_snapshot_rollback_test()");
        }
      }
      fVar1 = fdb_set_kv(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                         in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                         (size_t)in_stack_fffffffffffffd08);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x138e);
        in_memory_snapshot_rollback_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x138e,"void in_memory_snapshot_rollback_test()");
        }
      }
      fVar1 = fdb_commit((fdb_file_handle *)
                         CONCAT44(in_stack_fffffffffffffcec,
                                  CONCAT22(in_stack_fffffffffffffcea,in_stack_fffffffffffffce8)),
                         '\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1390);
        in_memory_snapshot_rollback_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1390,"void in_memory_snapshot_rollback_test()");
        }
      }
      fVar1 = fdb_rollback(handle_ptr,in_stack_fffffffffffffe10);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1394);
        in_memory_snapshot_rollback_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1394,"void in_memory_snapshot_rollback_test()");
        }
      }
      fdb_get_kvs_info(handle,in_stack_fffffffffffffe50);
      if (local_1d0 != handle_ptr) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1396);
        in_memory_snapshot_rollback_test::__test_pass = 0;
        if (local_1d0 != handle_ptr) {
          __assert_fail("kvs_info.last_seqnum == rollback_to",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1396,"void in_memory_snapshot_rollback_test()");
        }
      }
      fVar1 = fdb_snapshot_open(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                in_stack_ffffffffffffff90);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x139a);
        in_memory_snapshot_rollback_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x139a,"void in_memory_snapshot_rollback_test()");
        }
      }
      uVar2 = 0;
      uVar3 = 0;
      fdb_iterator_init(local_80,&local_88,(void *)0x0,0,(void *)0x0,0,0);
      local_1e0 = (fdb_kvs_handle **)0x0;
      do {
        fVar1 = fdb_iterator_get(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x13a1);
          in_memory_snapshot_rollback_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x13a1,"void in_memory_snapshot_rollback_test()");
          }
        }
        fdb_doc_free((fdb_doc *)0x1217a5);
        local_1e0 = (fdb_kvs_handle **)((long)local_1e0 + 1);
        fVar1 = fdb_iterator_next((fdb_iterator *)
                                  CONCAT44(in_stack_fffffffffffffcec,CONCAT22(uVar3,uVar2)));
      } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
      if (local_1e0 != handle_ptr) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x13a6);
        in_memory_snapshot_rollback_test::__test_pass = 0;
        if (local_1e0 != handle_ptr) {
          __assert_fail("c==rollback_to",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x13a6,"void in_memory_snapshot_rollback_test()");
        }
      }
      fdb_iterator_close(in_stack_fffffffffffffcf8);
      fdb_kvs_close((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffcec,CONCAT22(uVar3,uVar2)));
      fdb_close((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffcec,CONCAT22(uVar3,uVar2)));
      fdb_shutdown();
      memleak_end();
      if (in_memory_snapshot_rollback_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","in-memory snapshot rollback test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","in-memory snapshot rollback test");
      }
      return;
    }
    sprintf(&stack0xffffffffffffff99,"%d",(ulong)local_54);
    in_stack_fffffffffffffcf8 = local_78;
    strlen(&stack0xffffffffffffff99);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                       ,in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1385);
      in_memory_snapshot_rollback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1385,"void in_memory_snapshot_rollback_test()");
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void in_memory_snapshot_rollback_test()
{

    TEST_INIT();
    memleak_start();

    int i, r;
    char str[15];
    fdb_file_handle *file;
    fdb_kvs_handle *kvs, *snap_db;
    fdb_iterator *iterator;
    fdb_status status;
    fdb_config config;
    fdb_doc *rdoc;
    fdb_kvs_config kvs_config;
    fdb_kvs_info kvs_info;
    fdb_seqnum_t c, rollback_to = 3;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    status = fdb_open(&file, "mvcc_test1", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set 3 keys commits
    for(i=1;i<=3;i++) {
        sprintf(str, "%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // commit  normal
    fdb_commit(file, FDB_COMMIT_NORMAL);

    // set 2 more and commit w/flush
    status = fdb_set_kv(kvs, (void *)"key4", 4, (void*)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_kv(kvs, (void *)"key5", 4, (void*)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // rollback to 3
    status = fdb_rollback(&kvs, rollback_to);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_get_kvs_info(kvs, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == rollback_to);

    // take a in-mem snapshot and iterate over kvs
    status = fdb_snapshot_open(kvs, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    rdoc = NULL;
    c = 0;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        c++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(c==rollback_to);

    fdb_iterator_close(iterator);
    fdb_kvs_close(snap_db);
    fdb_close(file);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("in-memory snapshot rollback test");
}